

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O0

string * miniros::names::resolve(string *ns,string *name,bool _remap)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string error;
  string *copy;
  string *in_stack_00000200;
  string *in_stack_00000208;
  string *in_stack_fffffffffffffe38;
  InvalidNameException *in_stack_fffffffffffffe40;
  allocator<char> *in_stack_fffffffffffffe70;
  string *this;
  string *name_00;
  string *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  string local_148 [32];
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [38];
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78 [36];
  undefined4 local_54;
  allocator<char> local_4d [13];
  string local_40;
  byte local_19;
  string *local_18;
  string *local_10;
  
  local_19 = in_CL & 1;
  name_00 = &local_40;
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)name_00);
  bVar1 = validate(in_stack_00000208,in_stack_00000200);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_7a = 0;
      std::__cxx11::string::string((string *)in_RDI,local_18);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      if (*pcVar4 == '~') {
        this_node::getName_abi_cxx11_();
        std::__cxx11::string::substr((ulong)local_c0,(ulong)in_RDI);
        append(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        std::__cxx11::string::operator=((string *)in_RDI,local_a0);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_c0);
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      if (*pcVar4 != '/') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_RDI,in_stack_fffffffffffffe70);
        append(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        append(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        std::__cxx11::string::operator=((string *)in_RDI,local_e0);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator(&local_101);
      }
      clean(name_00);
      std::__cxx11::string::operator=((string *)in_RDI,local_148);
      std::__cxx11::string::~string(local_148);
      if ((local_19 & 1) != 0) {
        remap(in_stack_fffffffffffffe98);
        std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xfffffffffffffe98);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
      }
      local_7a = 1;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
        if (*pcVar4 == '/') {
          std::__cxx11::string::string((string *)in_RDI,local_10);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,(char *)in_RDI,in_stack_fffffffffffffe70);
          append(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator(&local_79);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_RDI,in_stack_fffffffffffffe70);
        std::allocator<char>::~allocator(local_4d);
      }
    }
    local_54 = 1;
    std::__cxx11::string::~string((string *)&local_40);
    return this;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  InvalidNameException::InvalidNameException(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  __cxa_throw(uVar2,&InvalidNameException::typeinfo,InvalidNameException::~InvalidNameException);
}

Assistant:

std::string resolve(const std::string& ns, const std::string& name, bool _remap)
{
  std::string error;
  if (!validate(name, error))
  {
    throw InvalidNameException(error);
  }

  if (name.empty())
  {
    if (ns.empty())
    {
      return "/";
    }

    if (ns[0] == '/')
    {
      return ns;
    }

    return append("/", ns);
  }

  std::string copy = name;

  if (copy[0] == '~')
  {
    copy = append(this_node::getName(), copy.substr(1));
  }

  if (copy[0] != '/')
  {
    copy = append("/", append(ns, copy));
  }

  copy = clean(copy);

  if (_remap)
  {
    copy = remap(copy);
  }

  return copy;
}